

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O0

Vector3 * __thiscall Sphere::getPoint(Sphere *this,double u,double v)

{
  Vector3 *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double Z;
  double in_XMM1_Qa;
  double phi;
  double theta;
  Vector3 *A;
  Vector3 local_60;
  Vector3 local_48;
  double local_30;
  double local_28;
  
  local_28 = (in_XMM0_Qa + in_XMM0_Qa) * ::PI;
  local_30 = (in_XMM1_Qa + -0.5) * ::PI;
  A = in_RDI;
  dVar1 = cos(local_28);
  dVar2 = cos(local_30);
  dVar3 = sin(local_28);
  dVar4 = cos(local_30);
  Z = sin(local_30);
  Vector3::Vector3(&local_60,dVar1 * dVar2,dVar3 * dVar4,Z);
  ::operator*(A,&in_RDI->x);
  operator+(A,in_RDI);
  Vector3::~Vector3(&local_48);
  Vector3::~Vector3(&local_60);
  return A;
}

Assistant:

Vector3 Sphere::getPoint(double u, double v)
{
    double theta = u * 2 * PI, phi = (v - .5) * PI;
    return Vector3(cos(theta) * cos(phi), sin(theta) * cos(phi), sin(phi)) * r + center;
}